

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *this;
  ostream *poVar4;
  ulong __s;
  string local_8a8 [8];
  string s_1;
  undefined1 local_888 [8];
  ofstream recor;
  int local_688;
  int local_684;
  int tot1;
  int win1;
  ifstream record;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_478;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_470;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_468;
  int local_460;
  int local_45c;
  int res;
  int i_1;
  vector<char,_std::allocator<char>_> baggy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [4];
  int wins;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8 [32];
  string local_3b8 [8];
  string dir;
  string local_398 [8];
  string ab;
  stringstream local_378 [8];
  stringstream sss;
  allocator local_1d9;
  string local_1d8 [32];
  stringstream local_1b8 [8];
  stringstream ss;
  char *s;
  int i;
  int verbosity;
  int num_games;
  bool go_first;
  bool playing_self;
  bool rebuild;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  verbosity._3_1_ = 0;
  verbosity._2_1_ = 0;
  verbosity._1_1_ = 1;
  i = -1;
  _num_games = argv;
  argv_local._0_4_ = argc;
  for (s._0_4_ = 0; (int)s < (int)argv_local; s._0_4_ = (int)s + 1) {
    pcVar1 = _num_games[(int)s];
    if (*pcVar1 == '-') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,pcVar1 + 3,&local_1d9);
      _Var3 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_1b8,local_1d8,_Var3);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::stringstream::stringstream(local_378);
      std::__cxx11::string::string(local_398);
      switch(pcVar1[1]) {
      case 'b':
        std::operator>>((istream *)local_1b8,(string *)board_file_abi_cxx11_);
        break;
      case 'c':
        std::__cxx11::string::string(local_3b8);
        std::operator>>((istream *)local_1b8,local_3b8);
        std::operator+(local_3d8,(char *)local_3b8);
        std::__cxx11::string::operator=((string *)board_file_abi_cxx11_,(string *)local_3d8);
        std::__cxx11::string::~string((string *)local_3d8);
        std::operator+(local_3f8,(char *)local_3b8);
        std::__cxx11::string::operator=((string *)tile_file_abi_cxx11_,(string *)local_3f8);
        std::__cxx11::string::~string((string *)local_3f8);
        std::operator+(local_418,(char *)local_3b8);
        std::__cxx11::string::operator=((string *)dict_file_abi_cxx11_,(string *)local_418);
        std::__cxx11::string::~string((string *)local_418);
        std::operator+(local_438,(char *)local_3b8);
        std::__cxx11::string::operator=((string *)dict_bin_abi_cxx11_,(string *)local_438);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::string::~string(local_3b8);
        break;
      case 'd':
        std::operator>>((istream *)local_1b8,(string *)dict_file_abi_cxx11_);
        break;
      case 'p':
        verbosity._2_1_ = 1;
        std::istream::operator>>((istream *)local_1b8,&i);
        s._4_4_ = *_num_games[3] + -0x30;
        if ((int)argv_local == 5) {
          verbosity._1_1_ = 0;
        }
        break;
      case 'r':
        verbosity._3_1_ = 1;
        break;
      case 't':
        std::operator>>((istream *)local_1b8,(string *)tile_file_abi_cxx11_);
      }
      std::__cxx11::string::~string(local_398);
      std::__cxx11::stringstream::~stringstream(local_378);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
  }
  init((EVP_PKEY_CTX *)(ulong)(verbosity._3_1_ & 1));
  if ((verbosity._2_1_ & 1) == 0) {
    calc_adj();
    while (bVar2 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&std::cin + *(long *)(std::cin + -0x18))), bVar2) {
      std::__cxx11::string::string(local_8a8);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_8a8)
      ;
      do_command((string *)local_8a8,false);
      std::__cxx11::string::~string(local_8a8);
    }
  }
  else {
    baggy.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&res,&bag);
    for (local_45c = 0; local_45c < i; local_45c = local_45c + 1) {
      local_460 = play_program((bool)(verbosity._1_1_ & 1),s._4_4_);
      clear();
      std::vector<char,_std::allocator<char>_>::operator=
                (&bag,(vector<char,_std::allocator<char>_> *)&res);
      local_468._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&bag);
      local_470._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&bag);
      __s = (ulong)seed;
      seed = seed + 1;
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine(&local_478,__s);
      std::
      shuffle<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                (local_468,local_470,&local_478);
      my_rack_size = 0;
      rack_size = 0;
      verbosity._1_1_ = (verbosity._1_1_ ^ 0xff) & 1;
      baggy.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
           (uint)(local_460 == 1) +
           baggy.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
      if (local_45c % 10 == 0) {
        std::ifstream::ifstream(&tot1,"record.txt",_S_in);
        local_684 = 0;
        local_688 = 0;
        this = (istream *)std::istream::operator>>((istream *)&tot1,&local_684);
        std::istream::operator>>(this,&local_688);
        std::ifstream::close();
        std::ofstream::ofstream(local_888,"record.txt",_S_trunc);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (local_888,
                            local_684 +
                            baggy.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
        poVar4 = std::operator<<(poVar4," ");
        std::ostream::operator<<(poVar4,local_688 + 10);
        std::ofstream::close();
        baggy.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
        std::ofstream::~ofstream(local_888);
        std::ifstream::~ifstream(&tot1);
      }
    }
    argv_local._4_4_ = 0;
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&res);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    bool rebuild = false;
    bool playing_self = false;
    bool go_first = true;
    int num_games = -1, verbosity;
    for (int i = 0; i < argc; i++) {
        char *s = argv[i];
        if (s[0] != '-') continue;
        stringstream ss(s + 3);
        stringstream sss;
        string ab;
        switch (s[1]) {
            case 'b':
                ss >> board_file;
                break;
            case 't':
                ss >> tile_file;
                break;
            case 'd':
                ss >> dict_file;
                break;
            case 'r':
                rebuild = true;
                break;
            case 'p':
                playing_self = true;
                ss >> num_games;
                verbosity = argv[3][0] - '0';
                //ab=string(argv[3]);
                //sss=stringstream{ab};
                //sss>>seed;
                if (argc == 5) go_first = false;
                break;
            case 'c':
                string dir;
                ss >> dir;
                board_file = dir + "/board.txt";
                tile_file = dir + "/tiles.txt";
                dict_file = dir + "/dict.txt";
                dict_bin = dir + "/dict.bin";
                break;
        }
    }
    init(rebuild);
    if (playing_self) {
        int wins = 0;
        const vector<char> baggy = bag;
        for (int i = 0; i < num_games; i++) {
            int res = play_program(go_first, verbosity);
            clear();
            bag = baggy;
            shuffle(bag.begin(), bag.end(), default_random_engine(seed++));
            rack_size = my_rack_size = 0;
            go_first = !go_first;
            wins += (res == 1);
            if (i % 10 == 0) {
                ifstream record("record.txt");
                int win1 = 0, tot1 = 0;
                record >> win1 >> tot1;
                record.close();
                ofstream recor("record.txt", ios::trunc);
                recor << win1 + wins << " " << tot1 + 10;
                recor.close();
                wins = 0;
            }
        }
        return 0;
    }
    calc_adj();
    while (cin) {
        string s;
        getline(cin, s);
        do_command(s, false);
    }
}